

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

byte * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>
          (SlabAllocatorBase<0> *this,size_t requestedBytes)

{
  byte *pbVar1;
  ulong uVar2;
  
  if (requestedBytes == 0) {
    TTDAbort_unrecoverable_error("Don\'t allocate empty arrays.");
  }
  if (requestedBytes < 0x1001) {
    uVar2 = (ulong)((int)requestedBytes + 3U & 0x3ffc);
    if ((requestedBytes <= uVar2) && (uVar2 < (ulong)this->m_slabBlockSize - 0x20)) {
      if (this->m_reserveActiveBytes == 0) {
        pbVar1 = this->m_currPos;
        if (this->m_endPos < pbVar1 + uVar2) {
          AddNewBlock(this);
          pbVar1 = this->m_currPos;
        }
        this->m_currPos = pbVar1 + uVar2;
        this->m_totalAllocatedSize = this->m_totalAllocatedSize + uVar2;
        return pbVar1;
      }
      TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
    }
    TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!")
    ;
  }
  TTDAbort_unrecoverable_error("Don\'t allocate large requests in the bump pool.");
}

Assistant:

byte* SlabAllocateRawSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes != 0, "Don't allocate empty arrays.");
            TTDAssert(requestedBytes <= TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate large requests in the bump pool.");

            byte* res = nullptr;
            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + canUnlink); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + canUnlink)) & (desiredsize < TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize)), "We can never allocate a block this big with the slab allocator!!");

            if (reserve)
            {
                TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

                if (this->m_currPos + desiredsize > this->m_endPos)
                {
                    this->AddNewBlock();
                }

                res = this->m_currPos;

                if (canUnlink)
                {
                    TTDAssert(canUnlink == sizeof(ptrdiff_t), "We need enough space for a ptr to the meta-data.");

                    //record the block associated with this allocation
                    *((ptrdiff_t*)res) = res - ((byte*)this->m_headBlock);

                    res += canUnlink;
                }
            }

            if (commit)
            {
                this->m_currPos += desiredsize;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                this->m_totalAllocatedSize += desiredsize;
#endif

                if (canUnlink)
                {
                    this->m_headBlock->RefCounter++;
                }
            }

            if (reserve && !commit)
            {
                this->m_reserveActiveBytes = desiredsize;
            }

            if (!reserve && commit)
            {
                TTDAssert(desiredsize <= this->m_reserveActiveBytes, "We are commiting more that we reserved.");

                this->m_reserveActiveBytes = 0;
            }

            return res;
        }